

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::weibull_dist<float>::pdf(weibull_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar1;
  float fVar2;
  result_type_conflict1 rVar3;
  undefined4 extraout_XMM0_Db;
  double dVar4;
  double dVar5;
  result_type_conflict1 t2;
  result_type_conflict1 t1;
  undefined4 local_4;
  
  if (0.0 <= in_XMM0_Da) {
    rVar1 = param_type::theta(in_RDI);
    fVar2 = in_XMM0_Da / rVar1;
    if (fVar2 <= 0.0) {
      rVar1 = param_type::beta(in_RDI);
      if ((rVar1 != 1.0) || (NAN(rVar1))) {
        rVar1 = param_type::beta(in_RDI);
        if (rVar1 <= 1.0) {
          local_4 = std::numeric_limits<float>::quiet_NaN();
        }
        else {
          local_4 = 0.0;
        }
      }
      else {
        rVar1 = param_type::theta(in_RDI);
        local_4 = 1.0 / rVar1;
      }
    }
    else {
      rVar1 = param_type::beta(in_RDI);
      dVar4 = std::pow((double)(ulong)(uint)fVar2,(double)CONCAT44(extraout_XMM0_Db,rVar1));
      rVar1 = param_type::beta(in_RDI);
      rVar3 = param_type::theta(in_RDI);
      dVar5 = std::exp((double)(ulong)(uint)-SUB84(dVar4,0));
      local_4 = (rVar1 / rVar3) * (SUB84(dVar4,0) / fVar2) * SUB84(dVar5,0);
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= P.theta();
      if (x > 0) {
        const result_type t1{math::pow(x, P.beta())};
        const result_type t2{t1 / x};
        return P.beta() / P.theta() * t2 * math::exp(-t1);
      }
      // x==0
      if (P.beta() == 1)
        return 1 / P.theta();
      if (P.beta() > 1)
        return 0;
      return math::numeric_limits<result_type>::quiet_NaN();
    }